

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messaging.c
# Opt level: O0

void send_cgreen_message(int messaging,int result)

{
  long *__s;
  undefined4 in_ESI;
  int in_EDI;
  int unaff_retaddr;
  CgreenMessage *message;
  
  __s = (long *)malloc(0x10);
  if (__s != (long *)0x0) {
    memset(__s,0,0x10);
    *__s = (long)queues[in_EDI].tag;
    *(undefined4 *)(__s + 1) = in_ESI;
    cgreen_pipe_write(unaff_retaddr,(void *)CONCAT44(in_EDI,in_ESI),(size_t)__s);
    sched_yield();
    free(__s);
  }
  return;
}

Assistant:

void send_cgreen_message(int messaging, int result) {
    CgreenMessage *message;
    
    message = (CgreenMessage *) malloc(sizeof(CgreenMessage));
    if (message == NULL) {
      return;
    }
    memset(message, 0, sizeof(*message));
    message->type = queues[messaging].tag;
    message->result = result;
    cgreen_pipe_write(queues[messaging].writepipe, message, sizeof(CgreenMessage));
    // give the parent a chance to read so that failures are more likely to be output
    // before the child crashes
    sched_yield();

    free(message);
}